

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::GenerateFastLdLen(Lowerer *this,Instr *ldLen,bool *instrIsInHelperBlockRef)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint32 offset;
  BailOutKind BVar4;
  undefined4 *puVar5;
  RegOpnd *this_00;
  LabelInstr *isNotObjectLabel;
  RegOpnd *pRVar6;
  SymOpnd *pSVar7;
  PropertySym *pPVar8;
  ArrayRegOpnd *this_01;
  StackSym *pSVar9;
  RegOpnd *opnd;
  RegOpnd *pRVar10;
  LabelInstr *pLVar11;
  IndirOpnd *pIVar12;
  IntConstOpnd *pIVar13;
  Opnd *pOVar14;
  LabelInstr *labelFallThru;
  Lowerer *pLVar15;
  undefined1 local_c8 [8];
  AutoReuseOpnd autoReuseArrayOpnd;
  AutoReuseOpnd autoReuseLengthOpnd;
  anon_class_24_3_5980dfa8 EnsureLengthOpnd;
  AutoReuseOpnd autoReuseArrayLengthOpnd;
  LabelInstr *local_50;
  RegOpnd *local_40;
  RegOpnd *lengthOpnd;
  ValueType srcValueType;
  
  if (instrIsInHelperBlockRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4c1b,"(instrIsInHelperBlockRef)","instrIsInHelperBlockRef");
    if (!bVar2) goto LAB_00550f68;
    *puVar5 = 0;
  }
  *instrIsInHelperBlockRef = false;
  pOVar14 = ldLen->m_src1;
  this_00 = IR::Opnd::AsRegOpnd(ldLen->m_dst);
  lengthOpnd._4_2_ = (pOVar14->m_valueType).field_0;
  isNotObjectLabel = IR::LabelInstr::New(Label,this->m_func,true);
  pLVar15 = (Lowerer *)ldLen;
  bVar2 = IR::Instr::DoStackArgsOpt(ldLen);
  if (bVar2) {
    IR::Instr::GetOrCreateContinueLabel(ldLen,false);
    GenerateFastArgumentsLdLen(this,ldLen,labelFallThru);
    IR::Instr::Remove(ldLen);
    return false;
  }
  bVar2 = ShouldGenerateArrayFastPath(pLVar15,pOVar14,false,true,false);
  bVar3 = ValueType::IsUninitialized((ValueType *)((long)&lengthOpnd + 4));
  lengthOpnd._7_1_ = true;
  if ((!bVar3) &&
     (lengthOpnd._7_1_ = ValueType::HasBeenString((ValueType *)((long)&lengthOpnd + 4)),
     !(bool)lengthOpnd._7_1_ && !bVar2)) {
    return true;
  }
  lengthOpnd._6_1_ = bVar2;
  bVar2 = IR::Opnd::IsRegOpnd(pOVar14);
  if (bVar2) {
    pRVar6 = IR::Opnd::AsRegOpnd(pOVar14);
  }
  else {
    pSVar7 = IR::Opnd::AsSymOpnd(pOVar14);
    pPVar8 = Sym::AsPropertySym(pSVar7->m_sym);
    pRVar6 = IR::RegOpnd::New(pPVar8->m_stackSym,TyVar,this->m_func);
    IR::Instr::ReplaceSrc1(ldLen,&pRVar6->super_Opnd);
  }
  bVar2 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)((long)&lengthOpnd + 4));
  if (bVar2) {
    offset = GetArrayOffsetOfLength((ValueType)lengthOpnd._4_2_);
  }
  else {
    offset = 0x20;
  }
  EnsureLengthOpnd.autoReuseLengthOpnd = (AutoReuseOpnd *)0x0;
  pRVar10 = pRVar6;
  if (lengthOpnd._6_1_ == 0) {
LAB_00550a45:
    local_50 = (LabelInstr *)0x0;
    opnd = (RegOpnd *)0x0;
  }
  else {
    bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)((long)&lengthOpnd + 4));
    if (bVar2) {
      bVar2 = IR::RegOpnd::IsArrayRegOpnd(pRVar6);
      if (bVar2) {
        this_01 = IR::RegOpnd::AsArrayRegOpnd(pRVar6);
        pSVar9 = IR::ArrayRegOpnd::LengthSym(this_01);
        if (pSVar9 != (StackSym *)0x0) {
          pSVar9 = IR::ArrayRegOpnd::LengthSym(this_01);
          opnd = IR::RegOpnd::New(pSVar9,TyUint32,this->m_func);
          opnd->field_0x18 = opnd->field_0x18 | 0x40;
          IR::AutoReuseOpnd::Initialize
                    ((AutoReuseOpnd *)&EnsureLengthOpnd.autoReuseLengthOpnd,&opnd->super_Opnd,
                     this->m_func,true);
          local_50 = (LabelInstr *)0x0;
          goto LAB_00550aa6;
        }
      }
      goto LAB_00550a45;
    }
    if (lengthOpnd._7_1_ == '\0') {
      local_50 = (LabelInstr *)0x0;
      pLVar11 = isNotObjectLabel;
    }
    else {
      local_50 = IR::LabelInstr::New(Label,this->m_func,false);
      pLVar11 = local_50;
    }
    opnd = (RegOpnd *)0x0;
    pRVar10 = GenerateArrayTest(this,pRVar6,isNotObjectLabel,pLVar11,ldLen,false,false,false);
  }
LAB_00550aa6:
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_c8,&pRVar10->super_Opnd,this->m_func,true)
  ;
  autoReuseLengthOpnd._16_8_ = &local_40;
  local_40 = (RegOpnd *)0x0;
  EnsureLengthOpnd.this = (Lowerer *)&autoReuseArrayOpnd.autoDelete;
  autoReuseArrayOpnd.autoDelete = false;
  autoReuseArrayOpnd.wasInUse = false;
  autoReuseArrayOpnd._18_6_ = 0;
  autoReuseLengthOpnd.func._1_1_ = 1;
  EnsureLengthOpnd.lengthOpnd = (RegOpnd **)this;
  if (lengthOpnd._6_1_ == 0) {
    if (lengthOpnd._7_1_ == '\0') goto LAB_00550c4c;
    pLVar11 = (LabelInstr *)0x0;
LAB_00550beb:
    GenerateStringTest(this,pRVar6,ldLen,isNotObjectLabel,(LabelInstr *)0x0,
                       (bool)(lengthOpnd._6_1_ ^ 1));
    GenerateFastLdLen::anon_class_24_3_5980dfa8::operator()
              ((anon_class_24_3_5980dfa8 *)&autoReuseLengthOpnd.autoDelete);
    pIVar12 = IR::IndirOpnd::New(pRVar6,0x18,TyUint32,this->m_func,false);
    InsertMove(&local_40->super_Opnd,&pIVar12->super_Opnd,ldLen,true);
    if (lengthOpnd._6_1_ != 0) {
      IR::Instr::InsertBefore(ldLen,&pLVar11->super_Instr);
    }
  }
  else if (opnd == (RegOpnd *)0x0) {
    GenerateFastLdLen::anon_class_24_3_5980dfa8::operator()
              ((anon_class_24_3_5980dfa8 *)&autoReuseLengthOpnd.autoDelete);
    pIVar12 = IR::IndirOpnd::New(pRVar10,offset,TyUint32,this->m_func,false);
    InsertMove(&local_40->super_Opnd,&pIVar12->super_Opnd,ldLen,true);
    if (lengthOpnd._7_1_ != '\0') goto LAB_00550bbc;
  }
  else {
    local_40 = opnd;
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete,&opnd->super_Opnd,this->m_func,true);
    if (lengthOpnd._7_1_ != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4c92,"(!stringFastPath)","!stringFastPath");
      if (!bVar2) goto LAB_00550f68;
      *puVar5 = 0;
LAB_00550bbc:
      pLVar11 = IR::LabelInstr::New(Label,this->m_func,false);
      InsertBranch(Br,pLVar11,ldLen);
      IR::Instr::InsertBefore(ldLen,&local_50->super_Instr);
      goto LAB_00550beb;
    }
  }
LAB_00550c4c:
  if (local_40 == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4cba,"(lengthOpnd)","lengthOpnd");
    if (!bVar2) goto LAB_00550f68;
    *puVar5 = 0;
  }
  if (((ldLen->field_0x38 & 0x10) != 0) &&
     (BVar4 = IR::Instr::GetBailOutKind(ldLen),
     (BVar4 & ~BailOutKindBits) == BailOutOnIrregularLength)) {
    BVar4 = IR::Instr::GetBailOutKind(ldLen);
    if ((BVar4 != BailOutOnIrregularLength) && (bVar2 = IR::Instr::HasLazyBailOut(ldLen), !bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4cbe,
                         "(ldLen->GetBailOutKind() == IR::BailOutOnIrregularLength || ldLen->HasLazyBailOut())"
                         ,
                         "ldLen->GetBailOutKind() == IR::BailOutOnIrregularLength || ldLen->HasLazyBailOut()"
                        );
      if (!bVar2) goto LAB_00550f68;
      *puVar5 = 0;
    }
    if ((this_00->super_Opnd).m_type != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4cbf,"(dst->IsInt32())","dst->IsInt32()");
      if (!bVar2) goto LAB_00550f68;
      *puVar5 = 0;
    }
    pRVar6 = local_40;
    pLVar15 = (Lowerer *)0x0;
    pIVar13 = IR::IntConstOpnd::New(0,(local_40->super_Opnd).m_type,this->m_func,true);
    InsertCompareBranch(pLVar15,&pRVar6->super_Opnd,&pIVar13->super_Opnd,BrLt_A,isNotObjectLabel,
                        ldLen,false);
    InsertMove(&this_00->super_Opnd,&local_40->super_Opnd,ldLen,true);
    pLVar11 = IR::Instr::GetOrCreateContinueLabel(ldLen,false);
    InsertBranch(Br,pLVar11,ldLen);
    IR::Instr::InsertBefore(ldLen,&isNotObjectLabel->super_Instr);
    *instrIsInHelperBlockRef = true;
    IR::Instr::FreeDst(ldLen);
    IR::Instr::FreeSrc1(ldLen);
    GenerateBailOut(this,ldLen,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_c8);
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&EnsureLengthOpnd.autoReuseLengthOpnd);
    return false;
  }
  pRVar6 = local_40;
  pLVar15 = (Lowerer *)0x0;
  pIVar13 = IR::IntConstOpnd::New(0,(local_40->super_Opnd).m_type,this->m_func,true);
  InsertCompareBranch(pLVar15,&pRVar6->super_Opnd,&pIVar13->super_Opnd,BrLt_A,isNotObjectLabel,ldLen
                      ,false);
  if ((this_00->super_Opnd).m_type != TyVar) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4cf5,"(dst->GetType() == TyVar)","dst->GetType() == TyVar");
    if (!bVar2) {
LAB_00550f68:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pOVar14 = IR::Opnd::Copy(&this_00->super_Opnd,this->m_func);
  pOVar14->m_type = TyInt32;
  InsertMove(pOVar14,&local_40->super_Opnd,ldLen,true);
  LowererMD::GenerateInt32ToVarConversion(&this->m_lowererMD,&this_00->super_Opnd,ldLen);
  pLVar11 = IR::Instr::GetOrCreateContinueLabel(ldLen,false);
  InsertBranch(Br,pLVar11,ldLen);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_c8);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&EnsureLengthOpnd.autoReuseLengthOpnd);
  IR::Instr::InsertBefore(ldLen,&isNotObjectLabel->super_Instr);
  *instrIsInHelperBlockRef = true;
  return true;
}

Assistant:

bool
Lowerer::GenerateFastLdLen(IR::Instr *ldLen, bool *instrIsInHelperBlockRef)
{
    Assert(instrIsInHelperBlockRef);
    bool &instrIsInHelperBlock = *instrIsInHelperBlockRef;
    instrIsInHelperBlock = false;

    //     TEST src, AtomTag                  -- check src not tagged int
    //     JNE $helper
    //     CMP [src], JavascriptArray::`vtable' -- check base isArray
    //     JNE $string
    //     MOV length, [src + offset(length)]     -- Load array length
    //     JMP $tovar
    // $string:
    //     CMP [src + offset(type)], static_string_type -- check src isString
    //     JNE $helper
    //     MOV length, [src + offset(length)]     -- Load string length
    // $toVar:
    //     TEST length, 0xC0000000       -- test for overflow of SHL, or negative
    //     JNE $helper
    //     SHL length, Js::VarTag_Shift  -- restore the var tag on the result
    //     INC length
    //     MOV dst, length
    //     JMP $fallthru
    // $helper:
    //     CALL GetProperty(src, length_property_id, scriptContext)
    // $fallthru:

    IR::Opnd *          opnd = ldLen->GetSrc1();
    IR::RegOpnd *       dst = ldLen->GetDst()->AsRegOpnd();
    const ValueType     srcValueType(opnd->GetValueType());

    IR::LabelInstr *const labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (ldLen->DoStackArgsOpt())
    {
        GenerateFastArgumentsLdLen(ldLen, ldLen->GetOrCreateContinueLabel());
        ldLen->Remove();
        return false;
    }
    else
    {
        const bool arrayFastPath = ShouldGenerateArrayFastPath(opnd, false, true, false);

        // HasBeenString instead of IsLikelyString because it could be a merge between StringObject and String, and this
        // information about whether it's a StringObject or some other object is not available in the profile data
        const bool stringFastPath = srcValueType.IsUninitialized() || srcValueType.HasBeenString();

        if(!(arrayFastPath || stringFastPath))
        {
            return true;
        }

        IR::RegOpnd * src;
        if (opnd->IsRegOpnd())
        {
            src = opnd->AsRegOpnd();
        }
        else
        {
            // LdLen has a PropertySymOpnd until globopt where the decision whether to convert it to LdFld is made. If globopt is skipped, the opnd will
            // still be a PropertySymOpnd here. In that case, do the conversion here.
            IR::SymOpnd * symOpnd = opnd->AsSymOpnd();
            PropertySym * propertySym = symOpnd->m_sym->AsPropertySym();
            src = IR::RegOpnd::New(propertySym->m_stackSym, IRType::TyVar, this->m_func);
            ldLen->ReplaceSrc1(src);
            opnd = src;
        }

        const int32 arrayOffsetOfLength =
            srcValueType.IsLikelyAnyOptimizedArray()
                ? GetArrayOffsetOfLength(srcValueType)
                : Js::JavascriptArray::GetOffsetOfLength();
        IR::LabelInstr *labelString = nullptr;
        IR::RegOpnd *arrayOpnd = src;
        IR::RegOpnd *arrayLengthOpnd = nullptr;
        IR::AutoReuseOpnd autoReuseArrayLengthOpnd;
        if(arrayFastPath)
        {
            if(!srcValueType.IsAnyOptimizedArray())
            {
                if(stringFastPath)
                {
                    // If we don't have info about the src value type or its object type, the array and string fast paths are
                    // generated
                    labelString = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
                }

                arrayOpnd = GenerateArrayTest(src, labelHelper, stringFastPath ? labelString : labelHelper, ldLen, false);
            }
            else if(src->IsArrayRegOpnd())
            {
                IR::ArrayRegOpnd *const arrayRegOpnd = src->AsArrayRegOpnd();
                if(arrayRegOpnd->LengthSym())
                {
                    arrayLengthOpnd = IR::RegOpnd::New(arrayRegOpnd->LengthSym(), TyUint32, m_func);
                    DebugOnly(arrayLengthOpnd->FreezeSymValue());
                    autoReuseArrayLengthOpnd.Initialize(arrayLengthOpnd, m_func);
                }
            }
        }
        const IR::AutoReuseOpnd autoReuseArrayOpnd(arrayOpnd, m_func);

        IR::RegOpnd *lengthOpnd = nullptr;
        IR::AutoReuseOpnd autoReuseLengthOpnd;
        const auto EnsureLengthOpnd = [&]()
        {
            if(lengthOpnd)
            {
                return;
            }

            lengthOpnd = IR::RegOpnd::New(TyUint32, m_func);
            autoReuseLengthOpnd.Initialize(lengthOpnd, m_func);
        };

        if(arrayFastPath)
        {
            if(arrayLengthOpnd)
            {
                lengthOpnd = arrayLengthOpnd;
                autoReuseLengthOpnd.Initialize(lengthOpnd, m_func);
                Assert(!stringFastPath);
            }
            else
            {
                //     MOV length, [array + offset(length)]     -- Load array length
                EnsureLengthOpnd();
                IR::IndirOpnd *const indirOpnd = IR::IndirOpnd::New(arrayOpnd, arrayOffsetOfLength, TyUint32, this->m_func);
                InsertMove(lengthOpnd, indirOpnd, ldLen);
            }
        }

        if(stringFastPath)
        {
            IR::LabelInstr *labelToVar = nullptr;
            if(arrayFastPath)
            {
                //     JMP $tovar
                labelToVar = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
                InsertBranch(Js::OpCode::Br, labelToVar, ldLen);

                // $string:
                ldLen->InsertBefore(labelString);
            }

            //  CMP [src + offset(type)], static_stringtype -- check src isString
            //  JNE $helper
            GenerateStringTest(src, ldLen, labelHelper, nullptr, !arrayFastPath);

            //  MOV length, [src + offset(length)]     -- Load string length
            EnsureLengthOpnd();
            IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(src, offsetof(Js::JavascriptString, m_charLength), TyUint32, this->m_func);
            InsertMove(lengthOpnd, indirOpnd, ldLen);

            if(arrayFastPath)
            {
                // $toVar:
                ldLen->InsertBefore(labelToVar);
            }
        }

        Assert(lengthOpnd);

        if(ldLen->HasBailOutInfo() && (ldLen->GetBailOutKind() & ~IR::BailOutKindBits) == IR::BailOutOnIrregularLength)
        {
            Assert(ldLen->GetBailOutKind() == IR::BailOutOnIrregularLength || ldLen->HasLazyBailOut());
            Assert(dst->IsInt32());

            // Since the length is an unsigned int32, verify that when interpreted as a signed int32, it is not negative
            //     test length, length
            //     js $helper
            //     mov dst, length
            //     jmp $fallthrough
            InsertCompareBranch(
                lengthOpnd,
                IR::IntConstOpnd::New(0, lengthOpnd->GetType(), m_func, true),
                Js::OpCode::BrLt_A,
                labelHelper,
                ldLen);
            InsertMove(dst, lengthOpnd, ldLen);
            InsertBranch(Js::OpCode::Br, ldLen->GetOrCreateContinueLabel(), ldLen);

            // $helper:
            //     (Bail out with IR::BailOutOnIrregularLength)
            ldLen->InsertBefore(labelHelper);
            instrIsInHelperBlock = true;
            ldLen->FreeDst();
            ldLen->FreeSrc1();
            GenerateBailOut(ldLen);
            return false;
        }

    #if INT32VAR
        // Since the length is an unsigned int32, verify that when interpreted as a signed int32, it is not negative
        //     test length, length
        //     js $helper
        InsertCompareBranch(
            lengthOpnd,
            IR::IntConstOpnd::New(0, lengthOpnd->GetType(), m_func, true),
            Js::OpCode::BrLt_A,
            labelHelper,
            ldLen);
    #else
        // Since the length is an unsigned int32, verify that when interpreted as a signed int32, it is not negative.
        // Additionally, verify that the signed value's width is not greater than 31 bits, since it needs to be tagged.
        //     test length, 0xC0000000
        //     jne $helper
        InsertTestBranch(
            lengthOpnd,
            IR::IntConstOpnd::New(0xC0000000, TyUint32, this->m_func, true),
            Js::OpCode::BrNeq_A,
            labelHelper,
            ldLen);
    #endif

    #if INT32VAR
        //
        // dst_32 = MOV length
        // dst_64 = OR dst_64, Js::AtomTag_IntPtr
        //
        Assert(dst->GetType() == TyVar);

        IR::Opnd *dst32 = dst->Copy(this->m_func);
        dst32->SetType(TyInt32);

        // This will clear the top bits.
        InsertMove(dst32, lengthOpnd, ldLen);

        m_lowererMD.GenerateInt32ToVarConversion(dst, ldLen);
    #else
        // dst = SHL length, Js::VarTag_Shift  -- restore the var tag on the result
        InsertShift(
            Js::OpCode::Shl_A,
            false /* needFlags */,
            dst,
            lengthOpnd,
            IR::IntConstOpnd::New(Js::VarTag_Shift, TyInt8, this->m_func),
            ldLen);

        // dst = ADD dst, AtomTag
        InsertAdd(
            false /* needFlags */,
            dst,
            dst,
            IR::IntConstOpnd::New(Js::AtomTag_Int32, TyUint32, m_func, true),
            ldLen);
    #endif

        //  JMP $fallthrough
        InsertBranch(Js::OpCode::Br, ldLen->GetOrCreateContinueLabel(), ldLen);
    }

    // $helper:
    //      (caller generates helper call)
    ldLen->InsertBefore(labelHelper);
    instrIsInHelperBlock = true;

    return true; // fast path was generated, helper call will be in a helper block
}